

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O0

const_iterator __thiscall QDirListing::begin(QDirListing *this)

{
  long lVar1;
  QDirListingPrivate *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  QDirListingPrivate *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDirListingPrivate::beginIterating(in_RDI);
  const_iterator::const_iterator((const_iterator *)in_RDI,in_stack_ffffffffffffffc8);
  const_iterator::operator++((const_iterator *)in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (const_iterator)&DAT_aaaaaaaaaaaaaaaa;
  }
  __stack_chk_fail();
}

Assistant:

QDirListing::const_iterator QDirListing::begin() const
{
    d->beginIterating();
    const_iterator it{d};
    ++it;
    return it;
}